

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cc
# Opt level: O2

bool __thiscall lexical::analyse_identifier(lexical *this,iterator *it,Meta *m)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int column;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  int iVar5;
  Token t;
  string buf;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  size_type local_48;
  char local_40 [16];
  
  buf._M_dataplus._M_p = (pointer)&buf.field_2;
  buf._M_string_length = 0;
  buf.field_2._M_local_buf[0] = '\0';
  pcVar4 = it->_M_current;
  iVar5 = 0;
  do {
    pcVar2 = (m->end)._M_current;
    if (pcVar4 == pcVar2) {
LAB_0010c259:
      std::__cxx11::string::~string((string *)&buf);
      return pcVar4 != pcVar2;
    }
    if (iVar5 == 0) {
      pcVar4 = pcVar4 + -1;
      it->_M_current = pcVar4;
LAB_0010c177:
      iVar5 = 1;
    }
    else {
      if (iVar5 != 1) {
        iVar5 = m->line;
        column = m->column;
        bVar3 = Table::in_key(&this->table,&buf);
        Token::Token(&t,iVar5,column,(uint)!bVar3 + (uint)!bVar3 * 2 + 1,&buf);
        std::vector<Token,_std::allocator<Token>_>::push_back(&this->tokens,&t);
        if (t.type == 4) {
          local_50._M_p = local_40;
          local_58._0_4_ = 4;
          paVar1 = &t.name.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)t.name._M_dataplus._M_p == paVar1) {
            local_40[8] = t.name.field_2._8_1_;
            local_40[9] = t.name.field_2._9_1_;
            local_40[10] = t.name.field_2._10_1_;
            local_40[0xb] = t.name.field_2._11_1_;
            local_40[0xc] = t.name.field_2._12_1_;
            local_40[0xd] = t.name.field_2._13_1_;
            local_40[0xe] = t.name.field_2._14_1_;
            local_40[0xf] = t.name.field_2._15_1_;
          }
          else {
            local_50._M_p = t.name._M_dataplus._M_p;
          }
          local_48 = t.name._M_string_length;
          t.name._M_string_length = 0;
          t.name.field_2._M_local_buf[0] = '\0';
          t.name._M_dataplus._M_p = (pointer)paVar1;
          std::
          _Rb_tree<Symbol,_Symbol,_std::_Identity<Symbol>,_std::less<Symbol>,_std::allocator<Symbol>_>
          ::_M_insert_unique<Symbol>(&(this->symbols)._M_t,(Symbol *)local_58);
          std::__cxx11::string::~string((string *)&local_50);
        }
        std::__cxx11::string::~string((string *)&t.name);
        goto LAB_0010c259;
      }
      bVar3 = sutil::is_key(pcVar4,false);
      if (bVar3) {
        std::__cxx11::string::push_back((char)&buf);
        pcVar4 = it->_M_current;
        goto LAB_0010c177;
      }
      pcVar4 = it->_M_current + -1;
      it->_M_current = pcVar4;
      iVar5 = 2;
    }
    pcVar4 = pcVar4 + 1;
    it->_M_current = pcVar4;
  } while( true );
}

Assistant:

bool lexical::analyse_identifier(string::iterator &it, const Meta &m) {
    int state = 0;
    string buf;
    while (it != m.end) {
        switch (state) {
            case 0: {
                --it;
                state = 1;
                break;
            }
            case 1: {
                if (sutil::is_key(*it))buf.push_back(*it);
                else {
                    --it;
                    state = 2;
                }
                break;
            }
            case 2: {
                Token t(m.line, m.column, table.in_key(buf) ? Token::KEY_WORD : Token::IDENTIFIER, buf);
                tokens.push_back(t);
                if(t.type == Token::IDENTIFIER) {
                    symbols.insert(Symbol(t.type, t.name));
                }
                return true;
            }
        }
        ++it;
    }
    return false;
}